

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Storage::Encodings::MFM::Parser::install_track(Parser *this,Address *address)

{
  bool bVar1;
  element_type *peVar2;
  Density *pDVar3;
  element_type *peVar4;
  SectorMap local_148;
  SectorMap local_118;
  SectorMap local_e8;
  SectorMap local_a8;
  undefined1 local_78 [8];
  map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
  sectors_by_id;
  undefined1 local_38 [8];
  shared_ptr<Storage::Disk::Track> track;
  _Self local_20;
  Address *local_18;
  Address *address_local;
  Parser *this_local;
  
  local_18 = address;
  address_local = (Address *)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>_>_>_>
       ::find(&this->sectors_by_address_by_track_,address);
  track.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       map<Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>_>_>_>
       ::end(&this->sectors_by_address_by_track_);
  bVar1 = std::operator!=(&local_20,
                          (_Self *)&track.
                                    super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
  if (!bVar1) {
    peVar2 = std::__shared_ptr_access<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    (*peVar2->_vptr_Disk[4])(local_38,peVar2,*local_18);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
    if (bVar1) {
      std::
      map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
      ::map((map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
             *)local_78);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&this->density_);
      if (bVar1) {
        peVar4 = std::
                 __shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_38);
        pDVar3 = std::optional<Storage::Encodings::MFM::Density>::operator*(&this->density_);
        parse_track(&local_a8,peVar4,*pDVar3);
        append(&local_a8,
               (map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
                *)local_78);
        std::
        map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
        ::~map(&local_a8);
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_38);
        parse_track(&local_e8,peVar4,Single);
        append(&local_e8,
               (map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
                *)local_78);
        std::
        map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
        ::~map(&local_e8);
        peVar4 = std::
                 __shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_38);
        parse_track(&local_118,peVar4,Double);
        append(&local_118,
               (map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
                *)local_78);
        std::
        map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
        ::~map(&local_118);
        peVar4 = std::
                 __shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_38);
        parse_track(&local_148,peVar4,High);
        append(&local_148,
               (map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
                *)local_78);
        std::
        map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
        ::~map(&local_148);
      }
      std::
      map<Storage::Disk::Track::Address,std::map<int,Storage::Encodings::MFM::Sector,std::less<int>,std::allocator<std::pair<int_const,Storage::Encodings::MFM::Sector>>>,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,std::map<int,Storage::Encodings::MFM::Sector,std::less<int>,std::allocator<std::pair<int_const,Storage::Encodings::MFM::Sector>>>>>>
      ::
      emplace<Storage::Disk::Track::Address_const&,std::map<int,Storage::Encodings::MFM::Sector,std::less<int>,std::allocator<std::pair<int_const,Storage::Encodings::MFM::Sector>>>>
                ((map<Storage::Disk::Track::Address,std::map<int,Storage::Encodings::MFM::Sector,std::less<int>,std::allocator<std::pair<int_const,Storage::Encodings::MFM::Sector>>>,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,std::map<int,Storage::Encodings::MFM::Sector,std::less<int>,std::allocator<std::pair<int_const,Storage::Encodings::MFM::Sector>>>>>>
                  *)&this->sectors_by_address_by_track_,local_18,
                 (map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
                  *)local_78);
      std::
      map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
      ::~map((map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>
              *)local_78);
      sectors_by_id._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
    }
    else {
      sectors_by_id._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
    }
    std::shared_ptr<Storage::Disk::Track>::~shared_ptr((shared_ptr<Storage::Disk::Track> *)local_38)
    ;
  }
  return;
}

Assistant:

void Parser::install_track(const Storage::Disk::Track::Address &address) {
	if(sectors_by_address_by_track_.find(address) != sectors_by_address_by_track_.end()) {
		return;
	}

	const auto track = disk_->get_track_at_position(address);
	if(!track) {
		return;
	}

	std::map<int, Storage::Encodings::MFM::Sector> sectors_by_id;
	if(density_) {
		append(parse_track(*track, *density_), sectors_by_id);
	} else {
		// Just try all three in succession.
		append(parse_track(*track, Density::Single), sectors_by_id);
		append(parse_track(*track, Density::Double), sectors_by_id);
		append(parse_track(*track, Density::High), sectors_by_id);
	}

	sectors_by_address_by_track_.emplace(address, std::move(sectors_by_id));
}